

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

NodeBase * __thiscall
SListBase<Memory::RecyclerWeakReference<Js::ArrayBufferParent>_*,_Memory::Recycler,_RealCount>::
EditingIterator::UnlinkCurrentNode(EditingIterator *this)

{
  RealCount *pRVar1;
  NodeBase *pNVar2;
  Type TVar3;
  NodeBase *addr;
  SListBase<Memory::RecyclerWeakReference<Js::ArrayBufferParent>_*,_Memory::Recycler,_RealCount>
  *pSVar4;
  code *pcVar5;
  NodeBase NVar6;
  bool bVar7;
  undefined4 *puVar8;
  NodeBase local_30;
  
  pNVar2 = (this->super_Iterator).current;
  if (pNVar2 == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x101,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar7) goto LAB_00b31ff9;
    *puVar8 = 0;
  }
  if ((SListBase<Memory::RecyclerWeakReference<Js::ArrayBufferParent>_*,_Memory::Recycler,_RealCount>
       *)(this->super_Iterator).current == (this->super_Iterator).list) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x102,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar7) goto LAB_00b31ff9;
    *puVar8 = 0;
  }
  if (this->last == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x103,"(last != nullptr)","last != nullptr");
    if (!bVar7) {
LAB_00b31ff9:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  TVar3.ptr = (((this->super_Iterator).current)->next).ptr;
  Memory::Recycler::WBSetBit((char *)&local_30);
  local_30.next.ptr = (Type)(Type)TVar3.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_30);
  NVar6.next.ptr = local_30.next.ptr;
  addr = this->last;
  Memory::Recycler::WBSetBit((char *)addr);
  (addr->next).ptr = (SListNodeBase<Memory::Recycler> *)NVar6.next.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pSVar4 = (this->super_Iterator).list;
  (this->super_Iterator).current = this->last;
  this->last = (NodeBase *)0x0;
  pRVar1 = &pSVar4->super_RealCount;
  pRVar1->count = pRVar1->count - 1;
  return pNVar2;
}

Assistant:

NodeBase * UnlinkCurrentNode()
        {
            NodeBase * unlinkedNode = const_cast<NodeBase *>(this->current);
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));
            Assert(last != nullptr);

            const_cast<NodeBase *>(last)->Next() = this->current->Next();
            this->current = last;
            last = nullptr;
            const_cast<SListBase *>(this->list)->DecrementCount();
            return unlinkedNode;
        }